

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::insert_move(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              *this,Node *keyval)

{
  uint8_t *puVar1;
  PropertyId PVar2;
  byte bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  PropertyDefinition *pPVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int iVar8;
  bool bVar9;
  uint8_t *puVar10;
  long lVar11;
  uint uVar12;
  Node *pNVar13;
  ulong uVar14;
  size_t insertion_idx;
  
  if (this->mMaxNumElementsAllowed == 0) {
    bVar9 = try_increase_info(this);
    if (!bVar9) {
      throwOverflowError(this);
    }
  }
  PVar2 = (keyval->mData).first;
  uVar14 = (ulong)PVar2 * -0x3f1b720669c11bf9;
  uVar12 = ((uint)(uVar14 >> 0x20) & 0x1f) >> ((byte)this->mInfoHashShift & 0x3f);
  insertion_idx = (uVar14 << 0x20 | uVar14 >> 0x20) >> 5 & this->mMask;
  puVar10 = this->mInfo;
  bVar3 = puVar10[insertion_idx];
  while (uVar12 = uVar12 + this->mInfoInc, uVar12 <= bVar3) {
    lVar11 = insertion_idx + 1;
    insertion_idx = insertion_idx + 1;
    bVar3 = puVar10[lVar11];
  }
  if (0xff < (uVar12 & 0xff) + this->mInfoInc) {
    this->mMaxNumElementsAllowed = 0;
  }
  lVar11 = 1;
  do {
    lVar11 = lVar11 + -1;
    puVar1 = puVar10 + insertion_idx;
    puVar10 = puVar10 + 1;
  } while (*puVar1 != '\0');
  pNVar13 = this->mKeyVals + insertion_idx;
  if (lVar11 == 0) {
    (pNVar13->mData).first = PVar2;
    Rml::Variant::Variant(&(pNVar13->mData).second.value,&(keyval->mData).second.value);
    (pNVar13->mData).second.parser_index = (keyval->mData).second.parser_index;
    iVar8 = (keyval->mData).second.specificity;
    pPVar5 = (keyval->mData).second.definition;
    (pNVar13->mData).second.unit = (keyval->mData).second.unit;
    (pNVar13->mData).second.specificity = iVar8;
    (pNVar13->mData).second.definition = pPVar5;
    (pNVar13->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (keyval->mData).second.source.
         super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (pNVar13->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = (keyval->mData).second.source.
             super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (keyval->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pNVar13->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var4;
    (keyval->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    shiftUp(this,insertion_idx - lVar11,insertion_idx);
    (pNVar13->mData).first = (keyval->mData).first;
    Rml::Variant::operator=(&(pNVar13->mData).second.value,&(keyval->mData).second.value);
    iVar8 = (keyval->mData).second.specificity;
    pPVar5 = (keyval->mData).second.definition;
    (pNVar13->mData).second.unit = (keyval->mData).second.unit;
    (pNVar13->mData).second.specificity = iVar8;
    (pNVar13->mData).second.definition = pPVar5;
    (pNVar13->mData).second.parser_index = (keyval->mData).second.parser_index;
    peVar6 = (keyval->mData).second.source.
             super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var7 = (keyval->mData).second.source.
             super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (keyval->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (keyval->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = (pNVar13->mData).second.source.
             super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (pNVar13->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
    (pNVar13->mData).second.source.
    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  this->mInfo[insertion_idx] = (uint8_t)uVar12;
  this->mNumElements = this->mNumElements + 1;
  return insertion_idx;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }